

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileOperation::
     Operation<short,duckdb::ReservoirQuantileState<short>,duckdb::ReservoirQuantileScalarOperation>
               (ReservoirQuantileState<short> *state,short *input,AggregateUnaryInput *unary_input)

{
  ReservoirQuantileBindData *this;
  BaseReservoirSampling *this_00;
  long in_RDI;
  ReservoirQuantileBindData *bind_data;
  undefined6 in_stack_ffffffffffffffd0;
  short in_stack_ffffffffffffffd6;
  idx_t in_stack_ffffffffffffffd8;
  
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)
             CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0));
  this = FunctionData::Cast<duckdb::ReservoirQuantileBindData>
                   ((FunctionData *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0));
  if (*(long *)(in_RDI + 0x10) == 0) {
    ReservoirQuantileState<short>::Resize
              ((ReservoirQuantileState<short> *)unary_input,(idx_t)bind_data);
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    this_00 = (BaseReservoirSampling *)operator_new(0x78);
    duckdb::BaseReservoirSampling::BaseReservoirSampling(this_00);
    *(BaseReservoirSampling **)(in_RDI + 0x18) = this_00;
  }
  ReservoirQuantileState<short>::FillReservoir
            ((ReservoirQuantileState<short> *)this,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd6);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_data = unary_input.input.bind_data->template Cast<ReservoirQuantileBindData>();
		if (state.pos == 0) {
			state.Resize(bind_data.sample_size);
		}
		if (!state.r_samp) {
			state.r_samp = new BaseReservoirSampling();
		}
		D_ASSERT(state.v);
		state.FillReservoir(bind_data.sample_size, input);
	}